

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::util_getCoeff(HModel *this,int row,int col,double *val)

{
  pointer piVar1;
  ostream *poVar2;
  ulong uVar3;
  double dVar4;
  
  printf("Called model.util_getCoeff(row=%d, col=%d)\n");
  std::ostream::flush();
  poVar2 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::endl<char,std::char_traits<char>>(poVar2);
  piVar1 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (ulong)piVar1[col];
  dVar4 = 0.0;
  do {
    if ((long)piVar1[(long)col + 1] <= (long)uVar3) {
LAB_001343c4:
      *val = dVar4;
      return;
    }
    if ((this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar3] == row) {
      if (-1 < (long)uVar3) {
        dVar4 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3 & 0xffffffff];
      }
      goto LAB_001343c4;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void HModel::util_getCoeff(int row, int col, double* val) {
  assert(row >= 0 && row < numRow);
  assert(col >= 0 && col < numCol);
#ifdef JAJH_dev
  printf("Called model.util_getCoeff(row=%d, col=%d)\n", row, col);cout << flush;
#endif
  //  printf("Called model.util_getCoeff(row=%d, col=%d)\n", row, col);cout << flush;

  cout << val << endl;


  int get_el = -1;
  for (int el=Astart[col]; el < Astart[col+1]; el++) {
    //  printf("Column %4d: Element %4d is row %4d. Is it %4d?\n", col, el, Aindex[el], row);cout << flush;
  if (Aindex[el] == row) {
  get_el = el;
  break;
}
}
  if (get_el < 0) {
    //  printf("model.util_getCoeff: Cannot find row %d in column %d\n", row, col);cout << flush;
  *val = 0;
} else { 
    //  printf("model.util_getCoeff: Found row %d in column %d as element %d: value %g\n", row, col, get_el, Avalue[get_el]);cout << flush;
  *val = Avalue[get_el];
}
}